

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

string __thiscall mjs::function_object::to_string(function_object *this)

{
  bool bVar1;
  gc_heap *h_00;
  gc_string *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  object *in_RSI;
  string sVar3;
  gc_heap_ptr<mjs::gc_string> local_1f8;
  wstring local_1e8 [32];
  wstring_view local_1c8;
  wstring_view local_1b8;
  wostringstream local_198 [8];
  wostringstream oss;
  gc_heap *h;
  function_object *this_local;
  
  h_00 = object::heap(in_RSI);
  if (((ulong)in_RSI[2]._vptr_object & 0x100000000) == 0) {
    gc_heap_ptr_untracked<mjs::gc_string,_true>::track
              ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&local_1f8,
               (gc_heap *)&in_RSI[1].class_);
    string::string((string *)this,&local_1f8);
    gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_1f8);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::__cxx11::wostringstream::wostringstream(local_198);
    std::operator<<((wostream *)local_198,"function ");
    bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                      ((gc_heap_ptr_untracked *)&in_RSI[1].class_);
    if (bVar1) {
      this_00 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&in_RSI[1].class_,h_00);
      local_1b8 = gc_string::view(this_00);
      std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_198,local_1b8);
    }
    std::operator<<((wostream *)local_198,"() { [native code] }");
    std::__cxx11::wostringstream::str();
    local_1c8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1e8);
    string::string((string *)this,h_00,&local_1c8);
    std::__cxx11::wstring::~wstring(local_1e8);
    std::__cxx11::wostringstream::~wostringstream(local_198);
    uVar2 = extraout_RDX;
  }
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar2;
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string function_object::to_string() const {
    auto& h = heap();
    if (is_native_) {
        std::wostringstream oss;
        oss << "function ";
        if (text_) {
            oss << text_.dereference(h).view();
        }
        oss << "() { [native code] }";
        return string{h, oss.str()};
    } else {
        return text_.track(h);
    }
}